

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  u8 uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  sqlite3_value *pRec;
  size_t sVar5;
  MemValue MVar6;
  char *pcVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  sqlite3_value *local_38;
  
  local_38 = (Mem *)0x0;
  for (; (bVar9 = pExpr->op, bVar9 == 0xae || (bVar9 == 0xb5)); pExpr = pExpr->pLeft) {
  }
  if (bVar9 == 0xb0) {
    bVar9 = pExpr->op2;
  }
  if (bVar9 == 0xad) {
    pExpr = pExpr->pLeft;
    bVar9 = pExpr->op;
    if ((bVar9 | 2) != 0x9b) {
      iVar3 = valueFromExpr(db,pExpr,enc,affinity,&local_38,pCtx);
      pRec = local_38;
      iVar4 = 0;
      if (local_38 != (Mem *)0x0 && iVar3 == 0) {
        sqlite3VdbeMemNumerify(local_38);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_0016ed49;
    }
    pcVar7 = "-";
    lVar8 = -1;
  }
  else {
    if (bVar9 == 0x24) {
      uVar1 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar3 = valueFromExpr(db,pExpr->pLeft,enc,uVar1,ppVal,pCtx);
      if (*ppVal == (Mem *)0x0) {
        return iVar3;
      }
      sqlite3VdbeMemCast(*ppVal,uVar1,enc);
      applyAffinity(*ppVal,affinity,enc);
      return iVar3;
    }
    pcVar7 = "";
    lVar8 = 1;
  }
  pRec = (Mem *)0x0;
  if (bVar9 < 0x9a) {
    if (bVar9 != 0x75) {
      if (bVar9 == 0x79) {
        pRec = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
        iVar4 = 0;
        if (pRec != (Mem *)0x0) {
          pRec->db = db;
          pRec->flags = 1;
          goto LAB_0016ed49;
        }
        goto LAB_0016ec43;
      }
      iVar4 = 0;
      if (bVar9 != 0x99) goto LAB_0016ed49;
    }
LAB_0016eab3:
    pRec = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
    if (pRec != (Mem *)0x0) {
      pRec->flags = 1;
      pRec->db = db;
      if ((pExpr->flags & 0x800) == 0) {
        pcVar7 = sqlite3MPrintf(db,"%s%s",pcVar7,(pExpr->u).zToken);
        if (pcVar7 == (char *)0x0) goto LAB_0016ec46;
        sqlite3VdbeMemSetStr(pRec,pcVar7,-1,'\x01',sqlite3OomClear);
      }
      else {
        (pRec->u).i = lVar8 * (pExpr->u).iValue;
        pRec->flags = 4;
      }
      uVar1 = 'C';
      if (affinity != 'A' || (bVar9 & 0xfd) != 0x99) {
        uVar1 = affinity;
      }
      applyAffinity(pRec,uVar1,'\x01');
      uVar2 = pRec->flags;
      if ((uVar2 & 0x2c) != 0) {
        uVar2 = uVar2 & 0xfffd;
        pRec->flags = uVar2;
      }
      iVar4 = 0;
      if (enc != '\x01') {
        if ((uVar2 & 2) == 0) {
          pRec->enc = enc;
        }
        else if (pRec->enc != enc) {
          iVar4 = sqlite3VdbeMemTranslate(pRec,enc);
        }
      }
LAB_0016ed49:
      *ppVal = pRec;
      return iVar4;
    }
  }
  else {
    if (bVar9 != 0x9a) {
      if (bVar9 == 0xaa) {
        pRec = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
        iVar4 = 0;
        if (pRec == (Mem *)0x0) {
          pRec = (Mem *)0x0;
        }
        else {
          pRec->db = db;
          pRec->flags = 4;
          MVar6.i._1_7_ = 0;
          MVar6.i._0_1_ = (pExpr->u).zToken[4] == '\0';
          pRec->u = MVar6;
        }
        goto LAB_0016ed49;
      }
      iVar4 = 0;
      pRec = (Mem *)0x0;
      if (bVar9 != 0x9b) goto LAB_0016ed49;
      goto LAB_0016eab3;
    }
    pRec = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
    iVar4 = 0;
    if (pRec != (Mem *)0x0) {
      pRec->flags = 1;
      pRec->db = db;
      pcVar7 = (pExpr->u).zToken;
      sVar5 = strlen(pcVar7 + 2);
      uVar10 = (uint)sVar5 & 0x3fffffff;
      iVar3 = uVar10 - 1;
      pcVar7 = (char *)sqlite3HexToBlob(db,pcVar7 + 2,iVar3);
      sqlite3VdbeMemSetStr
                (pRec,pcVar7,(ulong)(uint)((int)((uVar10 - (iVar3 >> 0x1f)) + -1) >> 1),'\0',
                 sqlite3OomClear);
      goto LAB_0016ed49;
    }
  }
LAB_0016ec43:
  pRec = (sqlite3_value *)0x0;
LAB_0016ec46:
  sqlite3OomFault(db);
  sqlite3ValueFree(pRec);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  const Expr *pExpr,              /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
  if( op==TK_REGISTER ) op = pExpr->op2;

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, enc);
      sqlite3ValueApplyAffinity(*ppVal, affinity, enc);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    assert( (pVal->flags & MEM_IntReal)==0 );
    if( pVal->flags & (MEM_Int|MEM_IntReal|MEM_Real) ){
      testcase( pVal->flags & MEM_Int );
      testcase( pVal->flags & MEM_Real );
      pVal->flags &= ~MEM_Str;
    }
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx)
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
#ifndef SQLITE_OMIT_FLOATING_POINT
        pVal->u.r = -(double)SMALLEST_INT64;
#else
        pVal->u.r = LARGEST_INT64;
#endif
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemSetNull(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 || NEVER(pCtx->pParse->nErr==0) )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}